

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O3

int Saig_ManCexRefineStep
              (Aig_Man_t *p,Vec_Int_t *vFlops,Vec_Int_t *vFlopClasses,Abc_Cex_t *pCex,
              int nFfToAddMax,int fTryFour,int fSensePath,int fVerbose)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  Aig_Man_t *pAbs;
  Vec_Int_t *vAbsFfsToAdd;
  Abc_Cex_t *pAVar4;
  Vec_Int_t *__ptr;
  long lVar5;
  int level;
  long lVar6;
  timespec local_48;
  Vec_Int_t *local_38;
  
  local_38 = vFlopClasses;
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pAbs = Saig_ManDupAbstraction(p,vFlops);
  iVar3 = Saig_ManCexFirstFlopPi(p,pAbs);
  if (fSensePath == 0) {
    vAbsFfsToAdd = Saig_ManExtendCounterExampleTest3(pAbs,iVar3,pCex,fVerbose);
  }
  else {
    vAbsFfsToAdd = Saig_ManExtendCounterExampleTest2(pAbs,iVar3,pCex,fVerbose);
  }
  if (vAbsFfsToAdd == (Vec_Int_t *)0x0) {
    Aig_ManStop(pAbs);
    return 0;
  }
  uVar1 = vAbsFfsToAdd->nSize;
  if (uVar1 == 0) {
    puts("Refinement did not happen. Discovered a true counter-example.");
    printf("Remapping counter-example from %d to %d primary inputs.\n",(ulong)(uint)pAbs->nObjs[2],
           (ulong)(uint)p->nObjs[2]);
    pAVar4 = Saig_ManCexRemap(p,pAbs,pCex);
    p->pSeqModel = pAVar4;
    if (vAbsFfsToAdd->pArray != (int *)0x0) {
      free(vAbsFfsToAdd->pArray);
    }
    free(vAbsFfsToAdd);
    Aig_ManStop(pAbs);
    return 0;
  }
  if (fVerbose != 0) {
    printf("Adding %d registers to the abstraction (total = %d).  ",(ulong)uVar1,
           (ulong)(p->nRegs + uVar1));
    level = 3;
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  }
  iVar3 = vAbsFfsToAdd->nSize;
  __ptr = vAbsFfsToAdd;
  if ((0 < nFfToAddMax) && (nFfToAddMax < iVar3)) {
    piVar2 = vAbsFfsToAdd->pArray;
    lVar5 = 0;
    do {
      piVar2[lVar5] = piVar2[lVar5] - p->nTruePis;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vAbsFfsToAdd->nSize);
    __ptr = Saig_ManCbaFilterFlops(p,pCex,local_38,vAbsFfsToAdd,nFfToAddMax);
    if (__ptr->nSize != nFfToAddMax) {
      __assert_fail("Vec_IntSize(vFlopsNewBest) == nFfToAddMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                    ,0x128,
                    "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                   );
    }
    printf("Filtering flops based on cost (%d -> %d).\n",(ulong)(uint)vAbsFfsToAdd->nSize,
           (ulong)(uint)nFfToAddMax);
    if (vAbsFfsToAdd->pArray != (int *)0x0) {
      free(vAbsFfsToAdd->pArray);
    }
    free(vAbsFfsToAdd);
    if (__ptr->nSize < 1) goto LAB_00619a5b;
    piVar2 = __ptr->pArray;
    lVar5 = 0;
    do {
      piVar2[lVar5] = piVar2[lVar5] + p->nTruePis;
      lVar5 = lVar5 + 1;
      iVar3 = __ptr->nSize;
    } while (lVar5 < iVar3);
  }
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      iVar3 = __ptr->pArray[lVar5];
      if (((long)iVar3 < 0) || (pAbs->vCiNumsOrig->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pAbs->vCiNumsOrig->pArray[iVar3];
      if (iVar3 < p->nTruePis) {
        __assert_fail("Entry >= Saig_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                      ,0x135,
                      "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                     );
      }
      if (p->nObjs[2] <= iVar3) {
        __assert_fail("Entry < Aig_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                      ,0x136,
                      "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                     );
      }
      Vec_IntPush(vFlops,iVar3 - p->nTruePis);
      lVar5 = lVar5 + 1;
    } while (lVar5 < __ptr->nSize);
  }
LAB_00619a5b:
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  Aig_ManStop(pAbs);
  return 1;
}

Assistant:

int Saig_ManCexRefineStep( Aig_Man_t * p, Vec_Int_t * vFlops, Vec_Int_t * vFlopClasses, Abc_Cex_t * pCex, int nFfToAddMax, int fTryFour, int fSensePath, int fVerbose )
{
    Aig_Man_t * pAbs;
    Vec_Int_t * vFlopsNew;
    int i, Entry;
    abctime clk = Abc_Clock();
    pAbs = Saig_ManDupAbstraction( p, vFlops );
    if ( fSensePath )
        vFlopsNew = Saig_ManExtendCounterExampleTest2( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fVerbose );
    else
//        vFlopsNew = Saig_ManExtendCounterExampleTest( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fTryFour, fVerbose );
        vFlopsNew = Saig_ManExtendCounterExampleTest3( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fVerbose );
    if ( vFlopsNew == NULL )
    {
        Aig_ManStop( pAbs );
        return 0;
    }
    if ( Vec_IntSize(vFlopsNew) == 0 )
    {
        printf( "Refinement did not happen. Discovered a true counter-example.\n" );
        printf( "Remapping counter-example from %d to %d primary inputs.\n", Aig_ManCiNum(pAbs), Aig_ManCiNum(p) );
        p->pSeqModel = Saig_ManCexRemap( p, pAbs, pCex );
        Vec_IntFree( vFlopsNew );
        Aig_ManStop( pAbs );
        return 0;
    }
    if ( fVerbose )
    {
        printf( "Adding %d registers to the abstraction (total = %d).  ", Vec_IntSize(vFlopsNew), Aig_ManRegNum(p)+Vec_IntSize(vFlopsNew) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    // vFlopsNew contains PI numbers that should be kept in pAbs
    // select the most useful flops among those to be added
    if ( nFfToAddMax > 0 && Vec_IntSize(vFlopsNew) > nFfToAddMax )
    {
        Vec_Int_t * vFlopsNewBest;
        // shift the indices
        Vec_IntForEachEntry( vFlopsNew, Entry, i )
            Vec_IntAddToEntry( vFlopsNew, i, -Saig_ManPiNum(p) );
        // create new flops
        vFlopsNewBest = Saig_ManCbaFilterFlops( p, pCex, vFlopClasses, vFlopsNew, nFfToAddMax );
        assert( Vec_IntSize(vFlopsNewBest) == nFfToAddMax );
        printf( "Filtering flops based on cost (%d -> %d).\n", Vec_IntSize(vFlopsNew), Vec_IntSize(vFlopsNewBest) );
        // update
        Vec_IntFree( vFlopsNew );
        vFlopsNew = vFlopsNewBest;
        // shift the indices
        Vec_IntForEachEntry( vFlopsNew, Entry, i )
            Vec_IntAddToEntry( vFlopsNew, i, Saig_ManPiNum(p) );
    }
    // add to the abstraction
    Vec_IntForEachEntry( vFlopsNew, Entry, i )
    {
        Entry = Vec_IntEntry(pAbs->vCiNumsOrig, Entry);
        assert( Entry >= Saig_ManPiNum(p) );
        assert( Entry < Aig_ManCiNum(p) );
        Vec_IntPush( vFlops, Entry-Saig_ManPiNum(p) );
    }
    Vec_IntFree( vFlopsNew );
    Aig_ManStop( pAbs );
    return 1;
}